

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O2

char * SoapySDRDevice_getDriverKey(SoapySDRDevice *device)

{
  undefined1 *puVar1;
  char *pcVar2;
  string local_30;
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014be88);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  (**(code **)(*(long *)device + 0x10))(&local_30,device);
  pcVar2 = toCString(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return pcVar2;
}

Assistant:

char *SoapySDRDevice_getDriverKey(const SoapySDRDevice *device)
{
    __SOAPY_SDR_C_TRY
    return toCString(device->getDriverKey());
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}